

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O3

void apprun_concat_path(char *dest,char *path)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  char cVar6;
  
  sVar2 = strlen(path);
  if (sVar2 != 0) {
    sVar3 = strlen(dest);
    if (sVar3 == 0) {
      lVar4 = 0;
    }
    else {
      lVar4 = sVar3 - (dest[sVar3 - 1] == '/');
    }
    cVar6 = dest[lVar4];
    if (cVar6 == '\0') {
      dest[lVar4] = '/';
      cVar6 = '/';
    }
    lVar5 = 0;
    do {
      cVar1 = path[lVar5];
      lVar4 = lVar4 + (ulong)(cVar1 != '/' || cVar6 != '/');
      dest[lVar4] = cVar1;
      lVar5 = lVar5 + 1;
      cVar6 = cVar1;
    } while (sVar2 + 1 != lVar5);
  }
  return;
}

Assistant:

void apprun_concat_path(char *dest, const char *path) {
    unsigned long path_len = strlen(path);
    if (path_len == 0)
        return;

    unsigned long dest_len = strlen(dest);
    unsigned long j = dest_len;

    if (j > 0 && dest[j - 1] == '/')
        j--;

    if (dest[j] == '\0')
        dest[j] = '/';

    // copy str avoiding repeated slashes
    for (int i = 0; i <= path_len; i++) {
        if (!(dest[j] == '/' && path[i] == '/'))
            j++;

        dest[j] = path[i];
    }
}